

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator::GenerateFieldInfo
          (RepeatedImmutableEnumFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  uint32_t number;
  
  WriteUInt32ToUtf16CharSequence(*(uint32_t *)(this->descriptor_ + 4),output);
  number = GetExperimentalJavaFieldType(this->descriptor_);
  WriteUInt32ToUtf16CharSequence(number,output);
  io::Printer::Print(printer,&this->variables_,"\"$name$_\",\n");
  if (*(char *)(*(long *)(this->descriptor_ + 0x10) + 0x3a) == '\x03') {
    return;
  }
  PrintEnumVerifierLogic
            (printer,this->descriptor_,&this->variables_,"$type$",",\n",
             (this->context_->options_).enforce_lite);
  return;
}

Assistant:

void RepeatedImmutableEnumFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  printer->Print(variables_, "\"$name$_\",\n");
  if (!SupportUnknownEnumValue(descriptor_->file())) {
    PrintEnumVerifierLogic(printer, descriptor_, variables_,
                           /*var_name=*/"$type$",
                           /*terminating_string=*/",\n",
                           /*enforce_lite=*/context_->EnforceLite());
  }
}